

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O3

void __thiscall
wasm::PrintExpressionContents::visitStringMeasure(PrintExpressionContents *this,StringMeasure *curr)

{
  long lVar1;
  ostream *stream;
  char *pcVar2;
  
  if (curr->op == StringMeasureWTF16) {
    stream = this->o;
    Colors::outputColorCode(stream,"\x1b[35m");
    Colors::outputColorCode(stream,"\x1b[1m");
    pcVar2 = "string.measure_wtf16";
    lVar1 = 0x14;
  }
  else {
    if (curr->op != StringMeasureUTF8) {
      handle_unreachable("invalid string.measure*",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Print.cpp"
                         ,0x9cf);
    }
    stream = this->o;
    Colors::outputColorCode(stream,"\x1b[35m");
    Colors::outputColorCode(stream,"\x1b[1m");
    pcVar2 = "string.measure_utf8";
    lVar1 = 0x13;
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,pcVar2,lVar1);
  Colors::outputColorCode(stream,"\x1b[0m");
  return;
}

Assistant:

void visitStringMeasure(StringMeasure* curr) {
    switch (curr->op) {
      case StringMeasureUTF8:
        printMedium(o, "string.measure_utf8");
        break;
      case StringMeasureWTF16:
        printMedium(o, "string.measure_wtf16");
        break;
      default:
        WASM_UNREACHABLE("invalid string.measure*");
    }
  }